

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::CatchScopeWalker::FetchValueAndAddress
          (CatchScopeWalker *this,DebuggerScopeProperty *scopeProperty,Var *pValue,
          IDiagObjectAddress **ppAddress)

{
  DiagStackFrame *pDVar1;
  code *pcVar2;
  Var pvVar3;
  bool bVar4;
  int iVar5;
  RegSlot RVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  RecyclableObject *originalInstance;
  RecyclableObject *instance;
  JavascriptLibrary *pJVar8;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar9;
  ScriptContext *pSVar10;
  undefined4 extraout_var_02;
  TrackAllocData local_c0;
  undefined1 local_91;
  code *pcStack_90;
  bool isInDeadZone_1;
  undefined8 local_88;
  TrackAllocData local_80;
  byte local_51;
  Var pvStack_50;
  bool isInDeadZone;
  Var obj;
  ScriptContext *scriptContext;
  IDiagObjectAddress *pAddress;
  Var outValue;
  ArenaAllocator *arena;
  IDiagObjectAddress **ppAddress_local;
  Var *pValue_local;
  DebuggerScopeProperty *scopeProperty_local;
  CatchScopeWalker *this_local;
  
  arena = (ArenaAllocator *)ppAddress;
  ppAddress_local = (IDiagObjectAddress **)pValue;
  pValue_local = (Var *)scopeProperty;
  scopeProperty_local = (DebuggerScopeProperty *)this;
  if ((pValue == (Var *)0x0) && (ppAddress == (IDiagObjectAddress **)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x6d3,"(pValue != nullptr || ppAddress != nullptr)",
                                "pValue != nullptr || ppAddress != nullptr");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  iVar5 = (*this->pFrame->_vptr_DiagStackFrame[0xe])();
  outValue = (Var)CONCAT44(extraout_var,iVar5);
  scriptContext = (ScriptContext *)0x0;
  iVar5 = (*this->pFrame->_vptr_DiagStackFrame[10])();
  obj = (Var)CONCAT44(extraout_var_00,iVar5);
  if (this->debuggerScope->scopeType == DiagCatchScopeInObject) {
    pDVar1 = this->pFrame;
    RVar6 = DebuggerScope::GetLocation(this->debuggerScope);
    iVar5 = (*pDVar1->_vptr_DiagStackFrame[0x12])(pDVar1,(ulong)RVar6);
    pvStack_50 = (Var)CONCAT44(extraout_var_01,iVar5);
    bVar4 = VarIs<Js::RecyclableObject>(pvStack_50);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x6dd,"(VarIs<RecyclableObject>(obj))",
                                  "VarIs<RecyclableObject>(obj)");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    originalInstance = VarTo<Js::RecyclableObject>(pvStack_50);
    instance = VarTo<Js::RecyclableObject>(pvStack_50);
    pAddress = (IDiagObjectAddress *)
               RecyclableObjectWalker::GetObject
                         (originalInstance,instance,*(PropertyId *)pValue_local,(ScriptContext *)obj
                         );
    local_51 = ScriptContext::IsUndeclBlockVar((ScriptContext *)obj,pAddress);
    if ((bool)local_51) {
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)obj);
      pAddress = (IDiagObjectAddress *)
                 JavascriptLibrary::GetDebuggerDeadZoneBlockVariableString(pJVar8);
    }
    pvVar3 = outValue;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_80,(type_info *)&RecyclableObjectAddress::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0x6e6);
    pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pvVar3,&local_80);
    pcStack_90 = Memory::ArenaAllocator::Alloc;
    local_88 = 0;
    pSVar10 = (ScriptContext *)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar9,0x3f67b0);
    RecyclableObjectAddress::RecyclableObjectAddress
              ((RecyclableObjectAddress *)pSVar10,pvStack_50,*(PropertyId *)pValue_local,pAddress,
               (uint)(local_51 & 1));
    scriptContext = pSVar10;
  }
  else {
    iVar5 = (*this->pFrame->_vptr_DiagStackFrame[5])
                      (this->pFrame,(ulong)*(uint *)((long)pValue_local + 4),0);
    pAddress = (IDiagObjectAddress *)CONCAT44(extraout_var_02,iVar5);
    local_91 = ScriptContext::IsUndeclBlockVar((ScriptContext *)obj,pAddress);
    if ((bool)local_91) {
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)obj);
      pAddress = (IDiagObjectAddress *)
                 JavascriptLibrary::GetDebuggerDeadZoneBlockVariableString(pJVar8);
    }
    pvVar3 = outValue;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_c0,(type_info *)&LocalObjectAddressForRegSlot::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0x6f1);
    pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pvVar3,&local_c0);
    pSVar10 = (ScriptContext *)new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar9,0x3f67b0);
    LocalObjectAddressForRegSlot::LocalObjectAddressForRegSlot
              ((LocalObjectAddressForRegSlot *)pSVar10,this->pFrame,
               *(RegSlot *)((long)pValue_local + 4),pAddress);
    scriptContext = pSVar10;
  }
  if (ppAddress_local != (IDiagObjectAddress **)0x0) {
    *ppAddress_local = pAddress;
  }
  if (arena != (ArenaAllocator *)0x0) {
    (arena->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
    super_Allocator.outOfMemoryFunc = (_func_void *)scriptContext;
  }
  return;
}

Assistant:

void CatchScopeWalker::FetchValueAndAddress(DebuggerScopeProperty &scopeProperty, _Out_opt_ Var *pValue, _Out_opt_ IDiagObjectAddress ** ppAddress)
    {
        Assert(pValue != nullptr || ppAddress != nullptr);

        ArenaAllocator* arena = pFrame->GetArena();
        Var outValue;
        IDiagObjectAddress * pAddress = nullptr;

        ScriptContext* scriptContext = pFrame->GetScriptContext();
        if (debuggerScope->scopeType == Js::DiagCatchScopeInObject)
        {
            Var obj = pFrame->GetInnerScopeFromRegSlot(debuggerScope->GetLocation());
            Assert(VarIs<RecyclableObject>(obj));

            outValue = RecyclableObjectWalker::GetObject(VarTo<RecyclableObject>(obj), VarTo<RecyclableObject>(obj), scopeProperty.propId, scriptContext);
            bool isInDeadZone = scriptContext->IsUndeclBlockVar(outValue);
            if (isInDeadZone)
            {
                outValue = scriptContext->GetLibrary()->GetDebuggerDeadZoneBlockVariableString();

            }
            pAddress = Anew(arena, RecyclableObjectAddress, obj, scopeProperty.propId, outValue, isInDeadZone);
        }
        else
        {
            outValue = pFrame->GetRegValue(scopeProperty.location);
            bool isInDeadZone = scriptContext->IsUndeclBlockVar(outValue);
            if (isInDeadZone)
            {
                outValue = scriptContext->GetLibrary()->GetDebuggerDeadZoneBlockVariableString();

            }
            pAddress = Anew(arena, LocalObjectAddressForRegSlot, pFrame, scopeProperty.location, outValue);
        }

        if (pValue)
        {
            *pValue = outValue;
        }

        if (ppAddress)
        {
            *ppAddress = pAddress;
        }
    }